

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::StartCall(ByteCodeWriter *this,OpCode op,ArgSlot ArgCount)

{
  ArgSlot local_2a [4];
  OpLayoutStartCall data;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x1c);
  local_2a[0] = ArgCount;
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,local_2a,2);
  return;
}

Assistant:

void ByteCodeWriter::StartCall(OpCode op, ArgSlot ArgCount)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::StartCall);

        OpLayoutStartCall data;
        data.ArgCount = ArgCount;
        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }